

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall Potassco::Application::processSignal(Application *this,int sig)

{
  long *plVar1;
  long lVar2;
  int iVar3;
  
  LOCK();
  plVar1 = &this->blocked_;
  lVar2 = *plVar1;
  *plVar1 = *plVar1 + 1;
  UNLOCK();
  if (lVar2 == 0) {
    iVar3 = (*this->_vptr_Application[0x12])(this,sig);
    if ((char)iVar3 == '\0') {
      return;
    }
  }
  else if (this->pending_ == 0) {
    (*this->_vptr_Application[7])(this,"Queueing signal...");
    this->pending_ = (long)sig;
  }
  LOCK();
  this->blocked_ = this->blocked_ + -1;
  UNLOCK();
  return;
}

Assistant:

void Application::processSignal(int sig) {
	if (fetch_and_inc(blocked_) == 0) {
		if (!onSignal(sig)) { return; } // block further signals
	}
	else if (pending_ == 0) { // signals are currently blocked because output is active
		info("Queueing signal...");
		pending_ = sig;
	}
	fetch_and_dec(blocked_);
}